

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O1

void TTD::NSLogEvents::JsRTRawBufferModifyAction_Emit<(TTD::NSLogEvents::EventKind)64>
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  ulong uVar1;
  
  if (evt->EventKind == RawBufferAsyncModificationRegister) {
    (*writer->_vptr_FileWriter[3])(writer,0x12,1);
    NSSnapValues::EmitTTDVar(*(TTDVar *)(evt + 1),writer,NoSeparator);
    FileWriter::WriteUInt32(writer,index,evt[2].EventKind,CommaSeparator);
    FileWriter::WriteLengthValue(writer,evt[2].ResultStatus,CommaSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    if (evt[2].ResultStatus != 0) {
      uVar1 = 0;
      do {
        (*writer->_vptr_FileWriter[0xb])
                  (writer,(ulong)*(byte *)(evt[1].EventTimeStamp + uVar1),(ulong)(uVar1 != 0));
        uVar1 = uVar1 + 1;
      } while (uVar1 < (uint)evt[2].ResultStatus);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTRawBufferModifyAction_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTRawBufferModifyAction* bufferAction = GetInlineEventDataAs<JsRTRawBufferModifyAction, tag>(evt);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(bufferAction->Trgt, writer, NSTokens::Separator::NoSeparator);

            writer->WriteUInt32(NSTokens::Key::index, bufferAction->Index, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(bufferAction->Length, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < bufferAction->Length; ++i)
            {
                writer->WriteNakedByte(bufferAction->Data[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();
        }